

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_ags.cpp
# Opt level: O0

Id dxil_spv::emit_fp8_to_fp16_coopmat(Impl *impl,Id v,CooperativeMatrixUse use)

{
  Id IVar1;
  Id IVar2;
  Id IVar3;
  Builder *this;
  Operation *pOVar4;
  Operation *call;
  Operation *store;
  Id param;
  Id call_id;
  Id aux_types [2];
  Id f16_type;
  Id u8_type;
  Id rows_cols;
  Builder *builder;
  CooperativeMatrixUse use_local;
  Id v_local;
  Impl *impl_local;
  
  this = Converter::Impl::builder(impl);
  IVar1 = spv::Builder::makeUintConstant(this,0x10,false);
  IVar2 = spv::Builder::makeUintType(this,8);
  IVar3 = spv::Builder::makeUintConstant(this,use,false);
  aux_types[1] = spv::Builder::makeCooperativeMatrixType(this,IVar2,IVar1,IVar1,IVar3);
  IVar2 = spv::Builder::makeFloatType(this,0x10);
  IVar3 = spv::Builder::makeUintConstant(this,use,false);
  call_id = spv::Builder::makeCooperativeMatrixType(this,IVar2,IVar1,IVar1,IVar3);
  param = aux_types[1];
  aux_types[0] = call_id;
  IVar1 = SPIRVModule::get_helper_call_id(impl->spirv_module,CoopMatFP8toFP16,&param,2);
  IVar2 = Converter::Impl::create_variable(impl,StorageClassFunction,aux_types[1],(char *)0x0);
  pOVar4 = Converter::Impl::allocate(impl,OpStore);
  Operation::add_id(pOVar4,IVar2);
  Operation::add_id(pOVar4,v);
  Converter::Impl::add(impl,pOVar4,false);
  pOVar4 = Converter::Impl::allocate(impl,OpFunctionCall,aux_types[0]);
  Operation::add_id(pOVar4,IVar1);
  Operation::add_id(pOVar4,IVar2);
  Converter::Impl::add(impl,pOVar4,false);
  return pOVar4->id;
}

Assistant:

static spv::Id emit_fp8_to_fp16_coopmat(Converter::Impl &impl, spv::Id v, spv::CooperativeMatrixUse use)
{
	auto &builder = impl.builder();
	spv::Id rows_cols = builder.makeUintConstant(16);
	spv::Id u8_type = builder.makeCooperativeMatrixType(
		builder.makeUintType(8), rows_cols, rows_cols, builder.makeUintConstant(use));
	spv::Id f16_type = builder.makeCooperativeMatrixType(
		builder.makeFloatType(16), rows_cols, rows_cols, builder.makeUintConstant(use));

	spv::Id aux_types[2] = { u8_type, f16_type };
	spv::Id call_id = impl.spirv_module.get_helper_call_id(HelperCall::CoopMatFP8toFP16, aux_types, 2);

	// RADV workaround. Should pass as value, but NIR aborts.
	spv::Id param = impl.create_variable(spv::StorageClassFunction, u8_type);
	auto *store = impl.allocate(spv::OpStore);
	store->add_id(param);
	store->add_id(v);
	impl.add(store);

	auto *call = impl.allocate(spv::OpFunctionCall, f16_type);
	call->add_id(call_id);
	call->add_id(param);
	impl.add(call);

	return call->id;
}